

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeMemoryInit(TranslateToFuzzReader *this)

{
  Random *this_00;
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  uintptr_t uVar5;
  uintptr_t uVar6;
  uintptr_t uVar7;
  uint32_t uVar8;
  uint32_t x;
  Expression *pEVar9;
  Const *pCVar10;
  Const *pCVar11;
  Expression *pEVar12;
  
  if (this->allowMemory != false) {
    this_00 = &this->random;
    uVar8 = Random::upTo(this_00,(uint32_t)
                                 ((ulong)(*(long *)(this->wasm + 0x98) -
                                         *(long *)(this->wasm + 0x90)) >> 3));
    puVar3 = *(undefined8 **)(*(long *)(this->wasm + 0x90) + (ulong)uVar8 * 8);
    uVar4 = *puVar3;
    uVar5 = puVar3[1];
    iVar1 = *(int *)(puVar3 + 8);
    iVar2 = *(int *)(puVar3 + 7);
    uVar8 = Random::upTo(this_00,iVar1 - iVar2);
    x = Random::upTo(this_00,(iVar1 - iVar2) - uVar8);
    pEVar9 = makePointer(this);
    pCVar10 = Builder::makeConst<int>(&this->builder,uVar8);
    pCVar11 = Builder::makeConst<int>(&this->builder,x);
    uVar6 = *(uintptr_t *)**(long **)(this->wasm + 0x78);
    uVar7 = ((uintptr_t *)**(long **)(this->wasm + 0x78))[1];
    pEVar12 = (Expression *)
              MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x48,8);
    *(undefined8 *)pEVar12 = 0;
    (pEVar12->type).id = 0;
    *(undefined8 *)(pEVar12 + 1) = 0;
    pEVar12[1].type.id = 0;
    *(undefined8 *)(pEVar12 + 2) = 0;
    pEVar12[2].type.id = 0;
    *(undefined8 *)(pEVar12 + 3) = 0;
    pEVar12[3].type.id = 0;
    *(undefined8 *)(pEVar12 + 4) = 0;
    pEVar12->_id = MemoryInitId;
    (pEVar12->type).id = 0;
    *(undefined8 *)(pEVar12 + 1) = 0;
    *(undefined8 *)(pEVar12 + 1) = uVar4;
    pEVar12[1].type.id = uVar5;
    *(Expression **)(pEVar12 + 2) = pEVar9;
    pEVar12[2].type.id = (uintptr_t)pCVar10;
    *(Const **)(pEVar12 + 3) = pCVar11;
    pEVar12[3].type.id = uVar6;
    *(uintptr_t *)(pEVar12 + 4) = uVar7;
    wasm::MemoryInit::finalize();
    return pEVar12;
  }
  pEVar9 = makeTrivial(this,(Type)0x0);
  return pEVar9;
}

Assistant:

Expression* TranslateToFuzzReader::makeMemoryInit() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Index segIdx = upTo(wasm.dataSegments.size());
  Name segment = wasm.dataSegments[segIdx]->name;
  size_t totalSize = wasm.dataSegments[segIdx]->data.size();
  size_t offsetVal = upTo(totalSize);
  size_t sizeVal = upTo(totalSize - offsetVal);
  Expression* dest = makePointer();
  Expression* offset = builder.makeConst(int32_t(offsetVal));
  Expression* size = builder.makeConst(int32_t(sizeVal));
  return builder.makeMemoryInit(
    segment, dest, offset, size, wasm.memories[0]->name);
}